

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  uint32_t uVar3;
  uv__sockaddr src_addr;
  uv__sockaddr mcast_addr;
  sockaddr_in6 local_14c;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 uStack_114;
  undefined8 uStack_94;
  
  iVar1 = uv_ip4_addr(multicast_addr,0,&mcast_addr.in);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr(source_addr,0,&src_addr.in);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv__udp_maybe_deferred_bind(handle,2,4);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_128._0_4_ = 0;
    local_130 = 0;
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_inet_pton(2,interface_addr,(void *)((long)&local_130 + 4)), iVar1 != 0)) {
      return iVar1;
    }
    local_130 = CONCAT44(local_130._4_4_,mcast_addr.in6.sin6_flowinfo);
    local_128 = CONCAT44(local_128._4_4_,src_addr.in6.sin6_flowinfo);
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x27;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x28;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_130,0xc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,&mcast_addr.in6);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_ip6_addr(source_addr,0,&src_addr.in6);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv__udp_maybe_deferred_bind(handle,10,4);
    if (iVar1 != 0) {
      return iVar1;
    }
    memset(&local_130,0,0x108);
    uVar3 = 0;
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_ip6_addr(interface_addr,0,&local_14c), uVar3 = local_14c.sin6_scope_id,
       iVar1 != 0)) {
      return iVar1;
    }
    local_130 = CONCAT44(local_130._4_4_,uVar3);
    local_128 = CONCAT44(mcast_addr.in6.sin6_flowinfo,mcast_addr._0_4_);
    uStack_114 = mcast_addr._20_8_;
    uStack_94 = src_addr._20_8_;
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x2e;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x2f;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,iVar1,&local_130,0x108);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) &&                                        \
    !defined(__NetBSD__) &&                                         \
    !defined(__ANDROID__) &&                                        \
    !defined(__DragonFly__) &&                                      \
    !defined(__QNX__)
  int err;
  union uv__sockaddr mcast_addr;
  union uv__sockaddr src_addr;

  err = uv_ip4_addr(multicast_addr, 0, &mcast_addr.in);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, &mcast_addr.in6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, &src_addr.in6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          &mcast_addr.in6,
                                          interface_addr,
                                          &src_addr.in6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, &src_addr.in);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        &mcast_addr.in,
                                        interface_addr,
                                        &src_addr.in,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}